

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O3

void __thiscall
duckdb::StreamingWindowState::Initialize
          (StreamingWindowState *this,ClientContext *context,DataChunk *input,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *expressions)

{
  ExpressionType EVar1;
  long lVar2;
  ulong uVar3;
  Vector *pVVar4;
  StreamingWindowState *pSVar5;
  DataChunk *this_00;
  pointer pVVar6;
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
  *this_01;
  const_reference this_02;
  type pEVar7;
  BoundWindowExpression *wexpr;
  __uniq_ptr_impl<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
  *this_03;
  reference this_04;
  pointer pLVar8;
  ulong uVar9;
  AggregateState *pAVar10;
  __uniq_ptr_impl<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
  *this_05;
  reference pvVar11;
  Allocator *pAVar12;
  pointer pEVar13;
  Vector *pVVar14;
  default_delete<duckdb::Vector> *pdVar15;
  DataChunk *this_06;
  size_type __n;
  initializer_list<duckdb::LogicalType> __l;
  DataChunk result;
  ExpressionExecutor executor;
  allocator_type local_141;
  Vector *local_140 [3];
  StreamingWindowState *local_128;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_120;
  DataChunk *local_118;
  DataChunk local_110;
  ExpressionExecutor local_d0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_88;
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
  *local_80;
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
  *local_78;
  Value local_70;
  
  local_120 = &this->const_vectors;
  local_118 = input;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ::resize(&local_120->
            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
           ,(long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_80 = &this->aggregate_states;
  ::std::
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
  ::resize(&local_80->
            super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>_>_>
           ,(long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_78 = &this->lead_lag_states;
  local_128 = this;
  ::std::
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
  ::resize(&local_78->
            super_vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>_>_>
           ,(long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(expressions->
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((expressions->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (expressions->
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    local_88 = expressions;
    do {
      this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](expressions,__n);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this_02);
      wexpr = BaseExpression::Cast<duckdb::BoundWindowExpression>(&pEVar7->super_BaseExpression);
      EVar1 = (pEVar7->super_BaseExpression).type;
      if (0xd < EVar1 - 0x78) {
        if (EVar1 == WINDOW_AGGREGATE) {
          pAVar12 = local_128->allocator;
          pAVar10 = (AggregateState *)operator_new(0x360);
          AggregateState::AggregateState(pAVar10,context,wexpr,pAVar12);
          local_d0.expressions.
          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pAVar10;
          this_05 = (__uniq_ptr_impl<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
                     *)vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
                       ::operator[](local_80,__n);
          ::std::
          __uniq_ptr_impl<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>_>
          ::reset(this_05,pAVar10);
          expressions = local_88;
        }
        goto switchD_014da55f_caseD_7a;
      }
      switch((uint)EVar1) {
      case 0x78:
      case 0x79:
        Value::Value((Value *)&local_d0,1);
        pVVar14 = (Vector *)operator_new(0x68);
        Vector::Vector(pVVar14,(Value *)&local_d0);
        local_110.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = pVVar14;
        pdVar15 = (default_delete<duckdb::Vector> *)
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](local_120,__n);
        goto LAB_014da6ac;
      case 0x7b:
        Value::Value((Value *)&local_d0,0.0);
        pVVar14 = (Vector *)operator_new(0x68);
        Vector::Vector(pVVar14,(Value *)&local_d0);
        local_110.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = pVVar14;
        pdVar15 = (default_delete<duckdb::Vector> *)
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](local_120,__n);
LAB_014da6ac:
        pVVar6 = local_110.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_110.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = (Vector *)0x0;
        pVVar14 = *(Vector **)pdVar15;
        *(pointer *)pdVar15 = pVVar6;
        if (pVVar14 != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()(pdVar15,pVVar14);
        }
        if (local_110.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&local_110,
                     local_110.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
        local_110.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        Value::~Value((Value *)&local_d0);
        break;
      case 0x82:
        ExpressionExecutor::ExpressionExecutor(&local_d0,context);
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&wexpr->children,0);
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar11);
        ExpressionExecutor::AddExpression(&local_d0,pEVar7);
        DataChunk::DataChunk(&local_110);
        pAVar12 = Allocator::Get(context);
        pvVar11 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&wexpr->children,0);
        pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(pvVar11);
        LogicalType::LogicalType((LogicalType *)local_140,&pEVar13->return_type);
        __l._M_len = 1;
        __l._M_array = (iterator)local_140;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70,
                   __l,&local_141);
        DataChunk::Initialize
                  (&local_110,pAVar12,(vector<duckdb::LogicalType,_true> *)&local_70,0x800);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70);
        LogicalType::~LogicalType((LogicalType *)local_140);
        ExpressionExecutor::Execute(&local_d0,local_118,&local_110);
        DataChunk::GetValue(&local_70,&local_110,0,0);
        pVVar14 = (Vector *)operator_new(0x68);
        Vector::Vector(pVVar14,&local_70);
        local_140[0] = pVVar14;
        pdVar15 = (default_delete<duckdb::Vector> *)
                  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](local_120,__n);
        pVVar4 = local_140[0];
        local_140[0] = (Vector *)0x0;
        pVVar14 = *(Vector **)pdVar15;
        *(Vector **)pdVar15 = pVVar4;
        if (pVVar14 != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()(pdVar15,pVVar14);
        }
        if (local_140[0] != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)local_140,local_140[0]);
        }
        local_140[0] = (Vector *)0x0;
        Value::~Value(&local_70);
        DataChunk::~DataChunk(&local_110);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
        ::~vector(&local_d0.states.
                   super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
                 );
        if ((AggregateState *)
            local_d0.expressions.
            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (AggregateState *)0x0) {
          operator_delete(local_d0.expressions.
                          super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                          .
                          super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        break;
      case 0x84:
      case 0x85:
        pAVar10 = (AggregateState *)operator_new(0x1b0);
        LeadLagState::LeadLagState((LeadLagState *)pAVar10,context,wexpr);
        this_01 = local_78;
        local_d0.expressions.
        super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pAVar10;
        this_03 = (__uniq_ptr_impl<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
                   *)vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                     ::operator[](local_78,__n);
        ::std::
        __uniq_ptr_impl<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>_>
        ::reset(this_03,(pointer)pAVar10);
        this_04 = vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                  ::operator[](this_01,__n);
        pLVar8 = unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
                 ::operator->(this_04);
        lVar2 = pLVar8->offset;
        if (lVar2 < 0) {
          uVar3 = local_128->lead_count;
          uVar9 = -lVar2;
          if ((ulong)-lVar2 < uVar3 || -uVar3 == lVar2) {
            uVar9 = uVar3;
          }
          local_128->lead_count = uVar9;
        }
      }
switchD_014da55f_caseD_7a:
      __n = __n + 1;
    } while (__n < (ulong)((long)(expressions->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(expressions->
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  this_00 = local_118;
  pSVar5 = local_128;
  if (local_128->lead_count != 0) {
    this_06 = &local_128->delayed;
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_d0,local_118);
    DataChunk::Initialize
              (this_06,context,(vector<duckdb::LogicalType,_true> *)&local_d0,
               pSVar5->lead_count + 0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_d0);
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_d0,this_00);
    DataChunk::Initialize
              (&pSVar5->shifted,context,(vector<duckdb::LogicalType,_true> *)&local_d0,
               pSVar5->lead_count + 0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_d0);
  }
  pSVar5->initialized = true;
  return;
}

Assistant:

void Initialize(ClientContext &context, DataChunk &input, const vector<unique_ptr<Expression>> &expressions) {
		const_vectors.resize(expressions.size());
		aggregate_states.resize(expressions.size());
		lead_lag_states.resize(expressions.size());

		for (idx_t expr_idx = 0; expr_idx < expressions.size(); expr_idx++) {
			auto &expr = *expressions[expr_idx];
			auto &wexpr = expr.Cast<BoundWindowExpression>();
			switch (expr.GetExpressionType()) {
			case ExpressionType::WINDOW_AGGREGATE:
				aggregate_states[expr_idx] = make_uniq<AggregateState>(context, wexpr, allocator);
				break;
			case ExpressionType::WINDOW_FIRST_VALUE: {
				// Just execute the expression once
				ExpressionExecutor executor(context);
				executor.AddExpression(*wexpr.children[0]);
				DataChunk result;
				result.Initialize(Allocator::Get(context), {wexpr.children[0]->return_type});
				executor.Execute(input, result);

				const_vectors[expr_idx] = make_uniq<Vector>(result.GetValue(0, 0));
				break;
			}
			case ExpressionType::WINDOW_PERCENT_RANK: {
				const_vectors[expr_idx] = make_uniq<Vector>(Value((double)0));
				break;
			}
			case ExpressionType::WINDOW_RANK:
			case ExpressionType::WINDOW_RANK_DENSE: {
				const_vectors[expr_idx] = make_uniq<Vector>(Value((int64_t)1));
				break;
			}
			case ExpressionType::WINDOW_LAG:
			case ExpressionType::WINDOW_LEAD: {
				lead_lag_states[expr_idx] = make_uniq<LeadLagState>(context, wexpr);
				const auto offset = lead_lag_states[expr_idx]->offset;
				if (offset < 0) {
					lead_count = MaxValue<idx_t>(idx_t(-offset), lead_count);
				}
				break;
			}
			default:
				break;
			}
		}
		if (lead_count) {
			delayed.Initialize(context, input.GetTypes(), lead_count + STANDARD_VECTOR_SIZE);
			shifted.Initialize(context, input.GetTypes(), lead_count + STANDARD_VECTOR_SIZE);
		}
		initialized = true;
	}